

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

int Cec_ManSatSolveExractPattern(Vec_Int_t *vCexStore,int iStart,Vec_Int_t *vPat)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  vPat->nSize = 0;
  if ((-2 < iStart) && ((int)(iStart + 1U) < vCexStore->nSize)) {
    uVar1 = iStart + 2;
    iVar4 = vCexStore->pArray[iStart + 1U];
    uVar3 = uVar1;
    if (0 < iVar4) {
      uVar2 = (ulong)uVar1;
      uVar3 = iVar4 + iStart + 2;
      do {
        if (((int)uVar1 < 0) || (vCexStore->nSize <= (int)uVar2)) goto LAB_0065b72e;
        Vec_IntPush(vPat,vCexStore->pArray[uVar2]);
        uVar2 = uVar2 + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    return uVar3;
  }
LAB_0065b72e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Cec_ManSatSolveExractPattern( Vec_Int_t * vCexStore, int iStart, Vec_Int_t * vPat )
{
    int k, nSize;
    Vec_IntClear( vPat );
    // skip the output number
    iStart++;
    // get the number of items
    nSize = Vec_IntEntry( vCexStore, iStart++ );
    if ( nSize <= 0 )
        return iStart;
    // extract pattern
    for ( k = 0; k < nSize; k++ )
        Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
    return iStart;
}